

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

Am_Object * __thiscall Am_Object::Remove_Slot(Am_Object *this,Am_Slot_Key key)

{
  uint *puVar1;
  Am_Object_Data *pAVar2;
  Am_Object AVar3;
  Am_Slot_Data *proto_slot;
  Am_Slot slot_00;
  CItem *pCVar4;
  uint i;
  Am_Slot_Data *slot;
  Am_Object local_40;
  uint local_34;
  Am_Object local_30;
  
  if (this->data != (Am_Object_Data *)0x0) {
    Am_Object_Data::find_slot_and_position(this->data,key,(Am_Slot_Data **)&local_30,&local_34);
    AVar3.data = local_30.data;
    if (local_30.data != (Am_Object_Data *)0x0) {
      local_40.data = local_30.data;
      pCVar4 = ((am_CList *)&(local_30.data)->next_instance)->head;
      if (pCVar4 != (CItem *)0x0) {
        do {
          (*(pCVar4->value->super_Am_Registered_Type)._vptr_Am_Registered_Type[6])
                    (pCVar4->value,&local_40,0,AVar3.data);
          pCVar4 = pCVar4->next;
        } while (pCVar4 != (CItem *)0x0);
      }
      DynArray::Delete(&this->data->data,local_34);
      if (((ulong)(local_30.data)->demon_set & 0x20) == 0) {
        pAVar2 = this->data->prototype;
        if (pAVar2 == (Am_Object_Data *)0x0) {
          proto_slot = (Am_Slot_Data *)0x0;
        }
        else {
          proto_slot = Am_Object_Data::find_slot(pAVar2,key);
        }
        if (proto_slot == (Am_Slot_Data *)0x0) {
          Am_Object_Data::delete_slot(this->data,(Am_Slot_Data *)local_30.data,(Am_Slot_Data *)0x0);
        }
        else {
          Am_Object_Data::delete_slot(this->data,(Am_Slot_Data *)local_30.data,proto_slot);
          pAVar2 = this->data;
          if ((proto_slot->enabled_demons & pAVar2->prototype->bits_mask) != 0) {
            puVar1 = &(pAVar2->super_Am_Wrapper).refs;
            *puVar1 = *puVar1 + 1;
            Am_Object_Advanced::Am_Object_Advanced((Am_Object_Advanced *)&local_40,pAVar2);
            slot_00 = Am_Object_Advanced::Get_Slot((Am_Object_Advanced *)&local_40,key);
            ~Am_Object(&local_40);
            Am_Object_Data::enqueue_change(this->data,slot_00.data);
          }
        }
      }
    }
    return this;
  }
  Am_Error("** Remove_Slot called on a (0L) object.");
}

Assistant:

Am_Object &
Am_Object::Remove_Slot(Am_Slot_Key key)
{
  if (!data)
    Am_Error("** Remove_Slot called on a (0L) object.");
  Am_Slot_Data *slot;
  unsigned i;
  data->find_slot_and_position(key, slot, i);
  if (slot) {
    slot->dependencies.Invalidate(slot, nullptr, *slot);
    data->data.Delete(i);
    if (!(slot->flags & BIT_IS_PART)) {
      Am_Slot_Data *slot_proto = nullptr;
      if (data->prototype)
        slot_proto = data->prototype->find_slot(key);
      if (slot_proto) {
        data->delete_slot(slot, slot_proto);
        if (slot_proto->enabled_demons & data->prototype->bits_mask) {
          data->Note_Reference();
          Am_Slot_Data *new_slot =
              (Am_Slot_Data *)Am_Object_Advanced(data).Get_Slot(key);
          data->enqueue_change(new_slot);
        }
      } else
        data->delete_slot(slot, nullptr);
    }
  }
  return *this;
}